

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sar.c
# Opt level: O1

ErrorNumber test_func_sar(TA_History *history)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  long lVar3;
  uint nbElement;
  TA_Integer *pTVar4;
  TA_Real *data;
  TA_Real *pTVar5;
  uint local_58;
  TA_Integer outBegIdx;
  TA_Real *local_50;
  TA_History *local_48;
  TA_Real *local_40;
  long local_38;
  
  local_48 = history;
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0x7c);
  pTVar4 = &tableTest[0].expectedNbElement;
  lVar3 = 0;
  do {
    if ((int)local_48->nbBars < *pTVar4) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_sar.c"
            );
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    local_38 = lVar3;
    clearAllBuffers();
    nbElement = 0x26;
    pTVar5 = wilderHigh;
    data = wilderLow;
    if (((TA_Test_conflict13 *)(pTVar4 + -0xd))->useWilderData == 0) {
      pTVar5 = local_48->high;
      data = local_48->low;
      nbElement = local_48->nbBars;
    }
    setInputBuffer(0,pTVar5,nbElement);
    setInputBuffer(1,data,nbElement);
    TVar1 = TA_SAR(pTVar4[-0xc],pTVar4[-0xb],gBuffer[0].in,gBuffer[1].in,*(double *)(pTVar4 + -9),
                   *(double *)(pTVar4 + -7),&outBegIdx,(int *)&local_58,gBuffer[0].out0);
    EVar2 = checkDataSame(gBuffer[0].in,pTVar5,nbElement);
    if ((EVar2 == TA_TEST_PASS) &&
       (local_40 = pTVar5, EVar2 = checkDataSame(gBuffer[1].in,data,nbElement),
       EVar2 == TA_TEST_PASS)) {
      local_50 = data;
      EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar4[-5],outBegIdx,pTVar4[-1],local_58,
                                 *pTVar4,*(TA_Real *)(pTVar4 + -3),pTVar4[-4]);
      if (EVar2 == TA_TEST_PASS) {
        local_58 = 0;
        outBegIdx = 0;
        TVar1 = TA_SAR(pTVar4[-0xc],pTVar4[-0xb],gBuffer[0].in,gBuffer[1].in,
                       *(double *)(pTVar4 + -9),*(double *)(pTVar4 + -7),&outBegIdx,(int *)&local_58
                       ,gBuffer[1].in);
        EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
        if (EVar2 == TA_TEST_PASS) {
          EVar2 = checkExpectedValue(gBuffer[1].in,TVar1,pTVar4[-5],outBegIdx,pTVar4[-1],local_58,
                                     *pTVar4,*(TA_Real *)(pTVar4 + -3),pTVar4[-4]);
          pTVar5 = local_40;
          if (EVar2 != TA_TEST_PASS) goto LAB_0011b1a0;
          EVar2 = checkDataSame(gBuffer[0].in,local_40,nbElement);
          if (EVar2 == TA_TEST_PASS) {
            clearAllBuffers();
            setInputBuffer(0,pTVar5,nbElement);
            setInputBuffer(1,local_50,nbElement);
            TVar1 = TA_SAR(pTVar4[-0xc],pTVar4[-0xb],gBuffer[0].in,gBuffer[1].in,
                           *(double *)(pTVar4 + -9),*(double *)(pTVar4 + -7),&outBegIdx,
                           (int *)&local_58,gBuffer[0].in);
            EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[0].in);
            if (EVar2 == TA_TEST_PASS) {
              EVar2 = checkExpectedValue(gBuffer[0].in,TVar1,pTVar4[-5],outBegIdx,pTVar4[-1],
                                         local_58,*pTVar4,*(TA_Real *)(pTVar4 + -3),pTVar4[-4]);
              if (EVar2 != TA_TEST_PASS) goto LAB_0011b1a0;
              EVar2 = checkDataSame(gBuffer[1].in,local_50,nbElement);
            }
          }
        }
      }
      else {
LAB_0011b1a0:
        printf("Fail for output id=%d\n");
      }
    }
    if (EVar2 != TA_TEST_PASS) {
      printf("%s Failed Test #%d (Code=%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_sar.c"
             ,local_38,(ulong)EVar2);
      return EVar2;
    }
    lVar3 = local_38 + 1;
    pTVar4 = pTVar4 + 0xe;
    if (lVar3 == 5) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_sar( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Set all the unstable period to a weird value. This is to make sure
    * that no unstable period affects the SAR.
    */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 124 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}